

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

int xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt,xmlNodePtr tree)

{
  int iVar1;
  int iVar2;
  xmlXIncludeRefPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlNodePtr pxVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr pxVar7;
  char *pcVar8;
  _xmlNode *p_Var9;
  xmlXIncludeRefPtr *ppxVar10;
  int iVar11;
  long lVar12;
  _xmlNode *p_Var13;
  xmlNodePtr cur;
  
  iVar11 = ctxt->incNr;
  lVar12 = (long)iVar11;
  p_Var9 = tree;
  do {
    if ((((p_Var9 == (xmlNodePtr)0x0) || (p_Var9->type != XML_ELEMENT_NODE)) ||
        (p_Var9->ns == (xmlNs *)0x0)) ||
       ((iVar1 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar1 == 0 &&
        (iVar1 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar1 == 0)))) {
LAB_001b636c:
      if ((p_Var9->children == (xmlNodePtr)0x0) ||
         (pxVar4 = p_Var9->children, (p_Var9->type | XML_COMMENT_NODE) != XML_DOCUMENT_NODE))
      goto LAB_001b6381;
    }
    else {
      iVar1 = xmlStrEqual(p_Var9->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude");
      if ((iVar1 != 0) && (ctxt->legacy == 0)) {
        ctxt->legacy = 1;
      }
      iVar1 = xmlStrEqual(p_Var9->name,(xmlChar *)"include");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(p_Var9->name,(xmlChar *)"fallback");
        if ((iVar1 != 0) &&
           (((p_Var13 = p_Var9->parent, p_Var13 == (_xmlNode *)0x0 ||
             (p_Var13->type != XML_ELEMENT_NODE)) ||
            ((p_Var13->ns == (xmlNs *)0x0 ||
             (((iVar1 = xmlStrEqual(p_Var13->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
               iVar1 == 0 &&
               (iVar1 = xmlStrEqual(p_Var9->parent->ns->href,
                                    (xmlChar *)"http://www.w3.org/2001/XInclude"), iVar1 == 0)) ||
              (iVar1 = xmlStrEqual(p_Var9->parent->name,(xmlChar *)"include"), iVar1 == 0)))))))) {
          xmlXIncludeErr(ctxt,p_Var9,0x650,"%s is not the child of an \'include\'\n",
                         (xmlChar *)"fallback");
        }
        goto LAB_001b636c;
      }
      p_Var13 = p_Var9->children;
      if (p_Var13 != (_xmlNode *)0x0) {
        iVar1 = 0;
        do {
          if (((p_Var13->type == XML_ELEMENT_NODE) && (p_Var13->ns != (xmlNs *)0x0)) &&
             ((iVar2 = xmlStrEqual(p_Var13->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
              iVar2 != 0 ||
              (iVar2 = xmlStrEqual(p_Var13->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
              iVar2 != 0)))) {
            iVar2 = xmlStrEqual(p_Var13->name,(xmlChar *)"include");
            if (iVar2 != 0) {
              iVar1 = 0x64e;
              pcVar8 = "%s has an \'include\' child\n";
              goto LAB_001b6356;
            }
            iVar2 = xmlStrEqual(p_Var13->name,(xmlChar *)"fallback");
            iVar1 = (iVar1 + 1) - (uint)(iVar2 == 0);
          }
          p_Var13 = p_Var13->next;
        } while (p_Var13 != (_xmlNode *)0x0);
        if (1 < iVar1) {
          iVar1 = 0x64f;
          pcVar8 = "%s has multiple fallback children\n";
LAB_001b6356:
          xmlXIncludeErr(ctxt,p_Var9,iVar1,pcVar8,(xmlChar *)"include");
          goto LAB_001b636c;
        }
      }
      pxVar3 = xmlXIncludeExpandNode(ctxt,p_Var9);
      if (pxVar3 != (xmlXIncludeRefPtr)0x0) {
        pxVar3->replace = 1;
      }
LAB_001b6381:
      while ((pxVar4 = p_Var9, p_Var9 != tree &&
             (pxVar4 = p_Var9->next, p_Var9->next == (xmlNodePtr)0x0))) {
        p_Var9 = p_Var9->parent;
        if (p_Var9 == (_xmlNode *)0x0) goto LAB_001b63ae;
      }
    }
  } while ((pxVar4 != (xmlNodePtr)0x0) && (p_Var9 = pxVar4, pxVar4 != tree));
LAB_001b63ae:
  iVar1 = ctxt->incNr;
  iVar2 = 0;
  if (iVar11 < iVar1) {
    ppxVar10 = ctxt->incTab;
    iVar2 = 0;
    do {
      pxVar3 = ppxVar10[lVar12];
      if (pxVar3->replace == 0) {
        if (pxVar3->inc != (xmlNodePtr)0x0) {
          xmlFreeNodeList(pxVar3->inc);
          ppxVar10 = ctxt->incTab;
          ppxVar10[lVar12]->inc = (xmlNodePtr)0x0;
        }
      }
      else {
        pxVar4 = pxVar3->elem;
        if ((pxVar4 != (xmlNodePtr)0x0) && (pxVar4->type != XML_NAMESPACE_DECL)) {
          cur = pxVar3->inc;
          pxVar3->inc = (xmlNodePtr)0x0;
          if ((pxVar4->parent == (_xmlNode *)0x0) || (pxVar4->parent->type == XML_ELEMENT_NODE)) {
LAB_001b6409:
            pxVar5 = cur;
            if ((ctxt->parseFlags & 0x8000) == 0) {
              if (pxVar3->fallback != 0) {
                xmlUnsetProp(pxVar4,"href");
              }
              pxVar4->type = XML_XINCLUDE_START;
              pxVar5 = pxVar4->children;
              while (pxVar5 != (xmlNodePtr)0x0) {
                p_Var9 = pxVar5->next;
                xmlUnlinkNode(pxVar5);
                xmlFreeNode(pxVar5);
                pxVar5 = p_Var9;
              }
              pxVar5 = xmlNewDocNode(pxVar4->doc,pxVar4->ns,pxVar4->name,(xmlChar *)0x0);
              if (pxVar5 != (xmlNodePtr)0x0) {
                pxVar5->type = XML_XINCLUDE_END;
                pxVar6 = xmlAddNextSibling(pxVar4,pxVar5);
                pxVar4 = cur;
                if (pxVar6 != (xmlNodePtr)0x0) {
                  do {
                    if (pxVar4 == (xmlNodePtr)0x0) goto LAB_001b65b0;
                    cur = pxVar4->next;
                    pxVar7 = xmlAddPrevSibling(pxVar5,pxVar4);
                    pxVar6 = pxVar4;
                    pxVar4 = cur;
                  } while (pxVar7 != (xmlNodePtr)0x0);
                  goto LAB_001b64d2;
                }
                goto LAB_001b64dd;
              }
            }
            else {
              do {
                if (pxVar5 == (xmlNodePtr)0x0) {
                  xmlUnlinkNode(pxVar4);
                  xmlFreeNode(pxVar4);
                  goto LAB_001b65b0;
                }
                cur = pxVar5->next;
                pxVar7 = xmlAddPrevSibling(pxVar4,pxVar5);
                pxVar6 = pxVar5;
                pxVar5 = cur;
              } while (pxVar7 != (xmlNodePtr)0x0);
LAB_001b64d2:
              pxVar5 = pxVar6;
              xmlUnlinkNode(pxVar5);
LAB_001b64dd:
              xmlFreeNode(pxVar5);
            }
            ctxt->fatalErr = 1;
            ctxt->errNo = 2;
            ctxt->nbErrors = ctxt->nbErrors + 1;
            xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                                (xmlError *)0x0);
          }
          else {
            if (cur == (xmlNodePtr)0x0) {
LAB_001b6548:
              pcVar8 = "XInclude error: would result in no root node\n";
            }
            else {
              iVar11 = 0;
              p_Var9 = cur;
              do {
                iVar11 = iVar11 + (uint)(p_Var9->type == XML_ELEMENT_NODE);
                p_Var9 = p_Var9->next;
              } while (p_Var9 != (_xmlNode *)0x0);
              if (iVar11 == 1) goto LAB_001b6409;
              pcVar8 = "XInclude error: would result in multiple root nodes\n";
              if (iVar11 == 0) goto LAB_001b6548;
            }
            xmlXIncludeErr(ctxt,pxVar4,0x64b,pcVar8,(xmlChar *)0x0);
          }
          xmlFreeNodeList(cur);
        }
LAB_001b65b0:
        ppxVar10 = ctxt->incTab;
        ppxVar10[lVar12]->replace = 0;
      }
      iVar2 = iVar2 + 1;
      lVar12 = lVar12 + 1;
      iVar1 = ctxt->incNr;
    } while (lVar12 < iVar1);
  }
  if (ctxt->isStream != 0) {
    if (0 < iVar1) {
      lVar12 = 0;
      do {
        xmlXIncludeFreeRef(ctxt->incTab[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < ctxt->incNr);
    }
    ctxt->incNr = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlXIncludeDoProcess(xmlXIncludeCtxtPtr ctxt, xmlNodePtr tree) {
    xmlXIncludeRefPtr ref;
    xmlNodePtr cur;
    int ret = 0;
    int i, start;

    /*
     * First phase: lookup the elements in the document
     */
    start = ctxt->incNr;
    cur = tree;
    do {
	/* TODO: need to work on entities -> stack */
        if (xmlXIncludeTestNode(ctxt, cur) == 1) {
            ref = xmlXIncludeExpandNode(ctxt, cur);
            /*
             * Mark direct includes.
             */
            if (ref != NULL)
                ref->replace = 1;
        } else if ((cur->children != NULL) &&
                   ((cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_ELEMENT_NODE))) {
            cur = cur->children;
            continue;
        }
        do {
            if (cur == tree)
                break;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
            cur = cur->parent;
        } while (cur != NULL);
    } while ((cur != NULL) && (cur != tree));

    /*
     * Second phase: extend the original document infoset.
     */
    for (i = start; i < ctxt->incNr; i++) {
	if (ctxt->incTab[i]->replace != 0) {
            xmlXIncludeIncludeNode(ctxt, ctxt->incTab[i]);
            ctxt->incTab[i]->replace = 0;
        } else {
            /*
             * Ignore includes which were added indirectly, for example
             * inside xi:fallback elements.
             */
            if (ctxt->incTab[i]->inc != NULL) {
                xmlFreeNodeList(ctxt->incTab[i]->inc);
                ctxt->incTab[i]->inc = NULL;
            }
        }
	ret++;
    }

    if (ctxt->isStream) {
        /*
         * incTab references nodes which will eventually be deleted in
         * streaming mode. The table is only required for XPointer
         * expressions which aren't allowed in streaming mode.
         */
        for (i = 0;i < ctxt->incNr;i++) {
            xmlXIncludeFreeRef(ctxt->incTab[i]);
        }
        ctxt->incNr = 0;
    }

    return(ret);
}